

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O2

void __thiscall
icu_63::UCharCharacterIterator::~UCharCharacterIterator(UCharCharacterIterator *this)

{
  void *in_RSI;
  
  CharacterIterator::~CharacterIterator((ForwardCharacterIterator *)this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

UBool
UCharCharacterIterator::operator==(const ForwardCharacterIterator& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }

    UCharCharacterIterator&    realThat = (UCharCharacterIterator&)that;

    return text == realThat.text
        && textLength == realThat.textLength
        && pos == realThat.pos
        && begin == realThat.begin
        && end == realThat.end;
}